

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O0

void __thiscall
capnp::EzRpcServer::Impl::Impl
          (Impl *this,Client *mainInterface,sockaddr *bindAddress,uint addrSize,
          ReaderOptions readerOpts)

{
  int iVar1;
  FixVoid<unsigned_int> value;
  Client *pCVar2;
  EzRpcContext *this_00;
  AsyncIoProvider *pAVar3;
  undefined4 extraout_var;
  NetworkAddress *pNVar4;
  ConnectionReceiver *pCVar5;
  Own<kj::ConnectionReceiver> *listener_00;
  ReaderOptions readerOpts_00;
  Promise<unsigned_int> local_88;
  ForkedPromise<unsigned_int> local_78;
  Own<kj::NetworkAddress> local_68;
  undefined1 local_58 [8];
  Own<kj::ConnectionReceiver> listener;
  uint addrSize_local;
  sockaddr *bindAddress_local;
  Client *mainInterface_local;
  Impl *this_local;
  ReaderOptions readerOpts_local;
  
  SturdyRefRestorer<capnp::AnyPointer>::SturdyRefRestorer
            (&this->super_SturdyRefRestorer<capnp::AnyPointer>);
  kj::TaskSet::ErrorHandler::ErrorHandler(&this->super_ErrorHandler);
  (this->super_SturdyRefRestorer<capnp::AnyPointer>).super_SturdyRefRestorerBase.
  _vptr_SturdyRefRestorerBase = (_func_int **)&PTR_baseRestore_00cd7b80;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00cd7ba8;
  pCVar2 = kj::mv<capnp::Capability::Client>(mainInterface);
  Capability::Client::Client(&this->mainInterface,pCVar2);
  EzRpcContext::getThreadLocal();
  std::
  map<kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>_>_>
  ::map(&this->exportMap);
  kj::ForkedPromise<unsigned_int>::ForkedPromise(&this->portPromise,(void *)0x0);
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler);
  this_00 = kj::Own<capnp::EzRpcContext>::operator->(&this->context);
  pAVar3 = EzRpcContext::getIoProvider(this_00);
  iVar1 = (*pAVar3->_vptr_AsyncIoProvider[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 8))
            (&local_68,(long *)CONCAT44(extraout_var,iVar1),bindAddress,addrSize);
  pNVar4 = kj::Own<kj::NetworkAddress>::operator->(&local_68);
  (*pNVar4->_vptr_NetworkAddress[1])(local_58);
  kj::Own<kj::NetworkAddress>::~Own(&local_68);
  pCVar5 = kj::Own<kj::ConnectionReceiver>::operator->((Own<kj::ConnectionReceiver> *)local_58);
  value = (*pCVar5->_vptr_ConnectionReceiver[1])();
  kj::Promise<unsigned_int>::Promise(&local_88,value);
  kj::Promise<unsigned_int>::fork((Promise<unsigned_int> *)&local_78);
  kj::ForkedPromise<unsigned_int>::operator=(&this->portPromise,&local_78);
  kj::ForkedPromise<unsigned_int>::~ForkedPromise(&local_78);
  kj::Promise<unsigned_int>::~Promise(&local_88);
  listener_00 = kj::mv<kj::Own<kj::ConnectionReceiver>>((Own<kj::ConnectionReceiver> *)local_58);
  readerOpts_00._12_4_ = 0;
  readerOpts_00.traversalLimitInWords = SUB128(readerOpts._0_12_,0);
  readerOpts_00.nestingLimit = SUB124(readerOpts._0_12_,8);
  acceptLoop(this,listener_00,readerOpts_00);
  kj::Own<kj::ConnectionReceiver>::~Own((Own<kj::ConnectionReceiver> *)local_58);
  return;
}

Assistant:

Impl(Capability::Client mainInterface, struct sockaddr* bindAddress, uint addrSize,
       ReaderOptions readerOpts)
      : mainInterface(kj::mv(mainInterface)),
        context(EzRpcContext::getThreadLocal()), portPromise(nullptr), tasks(*this) {
    auto listener = context->getIoProvider().getNetwork()
        .getSockaddr(bindAddress, addrSize)->listen();
    portPromise = kj::Promise<uint>(listener->getPort()).fork();
    acceptLoop(kj::mv(listener), readerOpts);
  }